

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnseenSlotRequestListView.cpp
# Opt level: O0

vector<Slot,_std::allocator<Slot>_> * __thiscall
UnseenSlotRequestListView::getQueryset(UnseenSlotRequestListView *this)

{
  bool bVar1;
  int iVar2;
  reference ppVar3;
  pair<const_int,_Slot> *i;
  iterator __end1;
  iterator __begin1;
  map<int,_Slot,_std::less<int>,_std::allocator<std::pair<const_int,_Slot>_>_> *__range1;
  UnseenSlotRequestListView *this_local;
  
  std::vector<Slot,_std::allocator<Slot>_>::clear
            (&(this->super_ListView<Slot>).super_MultipleObjectMixin<Slot>.objects);
  __end1 = std::map<int,_Slot,_std::less<int>,_std::allocator<std::pair<const_int,_Slot>_>_>::begin
                     (&Model<Slot>::objectList);
  i = (pair<const_int,_Slot> *)
      std::map<int,_Slot,_std::less<int>,_std::allocator<std::pair<const_int,_Slot>_>_>::end
                (&Model<Slot>::objectList);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&i);
    if (!bVar1) break;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_Slot>_>::operator*(&__end1);
    iVar2 = Slot::getApproved(&ppVar3->second);
    if (iVar2 == 0) {
      std::vector<Slot,_std::allocator<Slot>_>::push_back
                (&(this->super_ListView<Slot>).super_MultipleObjectMixin<Slot>.objects,
                 &ppVar3->second);
    }
    std::_Rb_tree_iterator<std::pair<const_int,_Slot>_>::operator++(&__end1);
  }
  return &(this->super_ListView<Slot>).super_MultipleObjectMixin<Slot>.objects;
}

Assistant:

vector<Slot> &UnseenSlotRequestListView::getQueryset() {
    objects.clear();
    for (auto &i : objectList) {
        if (i.second.getApproved() == 0) objects.push_back(i.second);
    }
    return objects;
}